

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void DebugRegisterWindow(CDebugWindow *wnd)

{
  CDebugWindow *wnd_local;
  
  if (wnd == (CDebugWindow *)0x0) {
    g_debugOutputFlags = g_debugOutputFlags & 0xfffffffb;
  }
  else {
    g_debugOutputFlags = g_debugOutputFlags | 4;
  }
  g_debugWindow = wnd;
  return;
}

Assistant:

void DebugRegisterWindow(CDebugWindow *wnd)
{
    if (wnd==NULL) {
        g_debugOutputFlags &= ~DBG_DEBUGWINDOW;
        g_debugWindow= wnd;
    }
    else {
        g_debugWindow= wnd;
        g_debugOutputFlags |= DBG_DEBUGWINDOW;
    }
}